

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O3

void BFS(Graph G)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int visited [100];
  int queue [100];
  int local_358 [100];
  uint auStack_1c8 [102];
  
  uVar5 = (ulong)(uint)visited[0x13];
  if (visited[0x13] < 1) {
    printf("BFS: ");
  }
  else {
    uVar10 = 0;
    memset(local_358,0,uVar5 * 4);
    printf("BFS: ");
    iVar7 = 0;
    do {
      iVar4 = iVar7;
      if (local_358[uVar10] == 0) {
        local_358[uVar10] = 1;
        putchar((int)*(char *)((long)visited + (uVar10 - 0x18)));
        iVar4 = iVar7 + 1;
        auStack_1c8[iVar7] = (uint)uVar10;
      }
      if (iVar7 != iVar4) {
        lVar8 = (long)iVar7;
        do {
          uVar1 = auStack_1c8[lVar8];
          if (uVar1 < (uint)visited[0x13]) {
            uVar11 = 0;
            do {
              if (visited[(ulong)uVar1 * 100 + uVar11 + 0x15] == 1) goto LAB_00101777;
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
          }
LAB_00101768:
          lVar8 = lVar8 + 1;
          iVar7 = iVar4;
        } while (iVar4 != (int)lVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
  }
  putchar(10);
  return;
LAB_00101777:
  uVar6 = uVar11 & 0xffffffff;
  if (local_358[uVar6] == 0) {
    local_358[uVar6] = 1;
    putchar((int)*(char *)((long)visited + (uVar6 - 0x18)));
    lVar2 = (long)iVar4;
    iVar4 = iVar4 + 1;
    auStack_1c8[lVar2] = (uint)uVar11;
  }
  if (((uint)visited[0x13] <= uVar1) || (visited[0x13] <= (int)(uint)uVar11)) goto LAB_00101768;
  piVar3 = visited + (ulong)uVar1 * 100 + uVar6 + 0x16;
  do {
    uVar9 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar9;
    if (visited[0x13] <= (int)uVar9) goto LAB_00101768;
    iVar7 = *piVar3;
    piVar3 = piVar3 + 1;
  } while (iVar7 != 1);
  if ((int)uVar9 < 0) goto LAB_00101768;
  goto LAB_00101777;
}

Assistant:

void BFS(Graph G){
    int head = 0;
    int rear = 0;
    int queue[MAX]; //辅助队列
    int visited[MAX];   //顶点访问标记
    int i,j,k;
    for(i = 0;i < G.vexnum; i++){   //初始化访问数组
        visited[i] = 0;
    }
    printf("BFS: ");
    for(i = 0;i < G.vexnum;i++){
        if(!visited[i]){
            visited[i] = 1;
            printf("%c",G.vexs[i]);
            queue[rear++] = i;  //入队列
        }
        while (head != rear){
            j = queue[head++];  //出队列
            for(k  = first_vertex(G,j); k >= 0;k = next_vertix(G,j,k))   //k是访问的邻接结点
            {
                if(!visited[k]){
                    visited[k] = 1;
                    printf("%c",G.vexs[k]);
                    queue[rear++] = k;
                }
            }
        }
    }
    printf("\n");
}